

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O1

void __thiscall DStrifeStatusBar::DrINumber(DStrifeStatusBar *this,int val,int x,int y,int imgBase)

{
  FTexture *pFVar1;
  uint uVar2;
  int x_00;
  
  x_00 = x + -7;
  if (val == 0) {
    pFVar1 = FImageCollection::operator[](&this->Images,imgBase);
    DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar1,x_00,y,(FRemapTable *)0x0);
    return;
  }
  do {
    pFVar1 = FImageCollection::operator[](&this->Images,val % 10 + imgBase);
    DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar1,x_00,y,(FRemapTable *)0x0);
    x_00 = x_00 + -7;
    uVar2 = val + 9;
    val = val / 10;
  } while (0x12 < uVar2);
  return;
}

Assistant:

void DrINumber (signed int val, int x, int y, int imgBase) const
	{
		x -= 7;

		if (val == 0)
		{
			DrawImage (Images[imgBase], x, y);
		}
		else
		{
			while (val != 0)
			{
				DrawImage (Images[imgBase+val%10], x, y);
				val /= 10;
				x -= 7;
			}
		}
	}